

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O2

uchar * ableton::discovery::v1::toNetworkByteStream<unsigned_char*>
                  (MessageHeader<ableton::link::NodeId> *header,uchar *out)

{
  ushort uVar1;
  uint8_t uVar2;
  uchar *puVar3;
  
  uVar2 = header->ttl;
  uVar1 = header->groupId;
  out[0] = header->messageType;
  out[1] = uVar2;
  *(ushort *)(out + 2) = uVar1 << 8 | uVar1 >> 8;
  puVar3 = discovery::detail::
           containerToNetworkByteStream<std::array<unsigned_char,8ul>,unsigned_char*>
                     (&(header->ident).super_NodeIdArray,out + 4);
  return puVar3;
}

Assistant:

It toNetworkByteStream(const MessageHeader& header, It out)
  {
    return discovery::toNetworkByteStream(header.ident,
      discovery::toNetworkByteStream(header.groupId,
        discovery::toNetworkByteStream(header.ttl,
          discovery::toNetworkByteStream(header.messageType, std::move(out)))));
  }